

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,FunctionType *type)

{
  uint uVar1;
  Type *type_00;
  uint index;
  Type *local_28;
  
  local_28 = FunctionType::getReturnType(type);
  append<char_const(&)[2],LLVMBC::Type*,char_const(&)[7]>
            (this,(char (*) [2])0x1a77ab,&local_28,(char (*) [7])" (*) (");
  index = 0;
  while( true ) {
    uVar1 = FunctionType::getNumParams(type);
    if (uVar1 <= index) break;
    type_00 = FunctionType::getParamType(type,index);
    append(this,type_00);
    index = index + 1;
    uVar1 = FunctionType::getNumParams(type);
    if (index < uVar1) {
      std::operator<<((ostream *)this,", ");
    }
  }
  std::operator<<((ostream *)this,"))");
  return;
}

Assistant:

void StreamState::append(FunctionType *type)
{
	append("(", type->getReturnType(), " (*) (");
	for (unsigned i = 0; i < type->getNumParams(); i++)
	{
		append(type->getParamType(i));
		if (i + 1 < type->getNumParams())
			append(", ");
	}
	append("))");
}